

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptPromise.cpp
# Opt level: O0

void __thiscall
Js::JavascriptPromiseAnyRejectElementFunction::JavascriptPromiseAnyRejectElementFunction
          (JavascriptPromiseAnyRejectElementFunction *this,DynamicType *type)

{
  nullptr_t local_20;
  DynamicType *local_18;
  DynamicType *type_local;
  JavascriptPromiseAnyRejectElementFunction *this_local;
  
  local_18 = type;
  type_local = (DynamicType *)this;
  JavascriptPromiseAllResolveElementFunction::JavascriptPromiseAllResolveElementFunction
            (&this->super_JavascriptPromiseAllResolveElementFunction,type);
  (this->super_JavascriptPromiseAllResolveElementFunction).super_RuntimeFunction.
  super_JavascriptFunction.super_DynamicObject.super_RecyclableObject.super_FinalizableObject.
  super_IRecyclerVisitedObject = (IRecyclerVisitedObject)&PTR_Finalize_01e3a770;
  local_20 = (nullptr_t)0x0;
  Memory::WriteBarrierPtr<Js::JavascriptPromiseResolveOrRejectFunctionAlreadyResolvedWrapper>::
  WriteBarrierPtr(&this->alreadyCalledWrapper,&local_20);
  return;
}

Assistant:

JavascriptPromiseAnyRejectElementFunction::JavascriptPromiseAnyRejectElementFunction(DynamicType* type)
        : JavascriptPromiseAllResolveElementFunction(type), alreadyCalledWrapper(nullptr)
    { }